

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

ParsingResult * __thiscall
QLocaleData::validateChars
          (ParsingResult *__return_storage_ptr__,QLocaleData *this,QStringView str,
          NumberMode numMode,int decDigits,NumberOptions number_options)

{
  int *piVar1;
  long lVar2;
  QStringView *pQVar3;
  QStringView *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  bool bVar6;
  byte bVar7;
  char c;
  NumericTokenizer tokens;
  byte local_2f4;
  int local_2f0;
  byte local_2e9;
  NumericData local_2e8;
  NumericTokenizer local_230;
  State local_158 [2];
  QVarLengthArray<char,_256LL> local_150;
  long local_38;
  
  lVar2 = str.m_size;
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_158,0xaa,0x120);
  local_158[0] = Invalid;
  local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_150.super_QVLABase<char>.super_QVLABaseBase.ptr =
       &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
  if (0x100 < lVar2) {
    QVLABase<char>::reallocate_impl
              (&local_150.super_QVLABase<char>,0x100,&local_150.super_QVLAStorage<1UL,_1UL,_256LL>,0
               ,lVar2);
  }
  memset(&local_230,0xaa,0xd8);
  numericData(&local_2e8,this,numMode);
  local_230.m_text.m_size = lVar2;
  local_230.m_text.m_data = str.m_data;
  local_230.m_guide.sysDecimal.d.d =
       (Data *)CONCAT71(local_2e8.sysDecimal.d.d._1_7_,(byte)local_2e8.sysDecimal.d.d);
  local_230.m_guide.sysDecimal.d.ptr = local_2e8.sysDecimal.d.ptr;
  local_230.m_guide.sysDecimal.d.size = local_2e8.sysDecimal.d.size;
  if ((QArrayData *)local_230.m_guide.sysDecimal.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_230.m_guide.sysDecimal.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
         = (((QArrayData *)local_230.m_guide.sysDecimal.d.d)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_230.m_guide.sysGroup.d.d = local_2e8.sysGroup.d.d;
  local_230.m_guide.sysGroup.d.ptr = local_2e8.sysGroup.d.ptr;
  local_230.m_guide.sysGroup.d.size = local_2e8.sysGroup.d.size;
  if (&(local_2e8.sysGroup.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_230.m_guide.sysMinus.d.d = local_2e8.sysMinus.d.d;
  local_230.m_guide.sysMinus.d.ptr = local_2e8.sysMinus.d.ptr;
  local_230.m_guide.sysMinus.d.size = local_2e8.sysMinus.d.size;
  if (&(local_2e8.sysMinus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_230.m_guide.sysPlus.d.d = local_2e8.sysPlus.d.d;
  local_230.m_guide.sysPlus.d.ptr = local_2e8.sysPlus.d.ptr;
  local_230.m_guide.sysPlus.d.size = local_2e8.sysPlus.d.size;
  if (&(local_2e8.sysPlus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
    ;
    UNLOCK();
  }
  pQVar3 = &local_2e8.decimal;
  pQVar4 = &local_230.m_guide.decimal;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pQVar4->m_size = pQVar3->m_size;
    pQVar3 = (QStringView *)&pQVar3[-(ulong)bVar7].m_data;
    pQVar4 = (QStringView *)&pQVar4[-(ulong)bVar7].m_data;
  }
  local_230.m_guide.zeroUcs = local_2e8.zeroUcs;
  local_230.m_index = 0;
  local_230.lastMark = '.' - (numMode == IntegerMode);
  local_230.m_mode = numMode;
  if (&(local_2e8.sysPlus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2e8.sysPlus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e8.sysMinus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2e8.sysMinus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e8.sysGroup.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2e8.sysGroup.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT71(local_2e8.sysDecimal.d.d._1_7_,(byte)local_2e8.sysDecimal.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT71(local_2e8.sysDecimal.d.d._1_7_,(byte)local_2e8.sysDecimal.d.d),2,0x10);
    }
  }
  iVar5 = 0;
  bVar7 = 0;
  local_2f0 = decDigits;
  do {
    if (local_230.m_text.m_size <= local_230.m_index) {
      local_158[0] = Acceptable;
      if ((bVar7 - 0x2b < 0x3b) && ((0x400000000000007U >> ((ulong)(bVar7 - 0x2b) & 0x3f) & 1) != 0)
         ) {
        local_158[0] = Intermediate;
      }
      __return_storage_ptr__->state = local_158[0];
      QVarLengthArray<char,_256LL>::QVarLengthArray(&__return_storage_ptr__->buff,&local_150);
      break;
    }
    local_2e9 = anon_unknown.dwarf_c44a87::NumericTokenizer::nextToken(&local_230);
    if ((int)(char)local_2e9 - 0x30U < 10) {
      if (iVar5 == 1) {
        iVar5 = 1;
        bVar6 = local_2f0 == 0;
        local_2f0 = local_2f0 + -1;
        if (bVar6) goto LAB_003194b8;
      }
      else if (iVar5 == 2) {
        local_2f4 = (byte)(((uint)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>
                                  .super_QFlagsStorage<QLocale::NumberOption>.i & 8) >> 3);
        iVar5 = 2;
        if (((local_2e9 == 0x30 && (int)(char)bVar7 - 0x3aU < 0xfffffff6) & local_2f4) == 1)
        goto LAB_003194b8;
      }
      goto LAB_003194e1;
    }
    switch(local_2e9) {
    case 0x2b:
    case 0x2d:
      if ((bVar7 == 0) || (numMode == DoubleScientificMode && bVar7 == 0x65)) break;
LAB_003194b8:
      __return_storage_ptr__->state = Invalid;
      (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
      (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.s = 0;
      (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.ptr =
           &(__return_storage_ptr__->buff).super_QVLAStorage<1UL,_1UL,_256LL>;
      bVar6 = false;
      goto LAB_00319547;
    case 0x2c:
      if ((((uint)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                  super_QFlagsStorage<QLocale::NumberOption>.i & 2) != 0 || iVar5 != 0) ||
         (9 < (int)(char)bVar7 - 0x30U)) goto LAB_003194b8;
      iVar5 = 0;
      break;
    case 0x2e:
      if (iVar5 != 0 || numMode == IntegerMode) goto LAB_003194b8;
      iVar5 = 1;
      break;
    default:
      if ((local_2e9 != 0x65) || (numMode != DoubleScientificMode || iVar5 == 2)) goto LAB_003194b8;
      iVar5 = 2;
    }
LAB_003194e1:
    bVar6 = true;
    bVar7 = local_2e9;
    if (local_2e9 != 0x2c) {
      if (local_150.super_QVLABase<char>.super_QVLABaseBase.s ==
          local_150.super_QVLABase<char>.super_QVLABaseBase.a) {
        local_2e8.sysDecimal.d.d._0_1_ = local_2e9;
        QVLABase<char>::emplace_back_impl<char>
                  (&local_150.super_QVLABase<char>,0x100,
                   &local_150.super_QVLAStorage<1UL,_1UL,_256LL>,(char *)&local_2e8);
      }
      else {
        QVLABase<char>::emplace_back_impl<char_const&>
                  (&local_150.super_QVLABase<char>,0x100,
                   &local_150.super_QVLAStorage<1UL,_1UL,_256LL>,(char *)&local_2e9);
      }
    }
LAB_00319547:
  } while (bVar6);
  if (&(local_230.m_guide.sysPlus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_230.m_guide.sysPlus.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysPlus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.m_guide.sysMinus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_230.m_guide.sysMinus.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysMinus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.m_guide.sysGroup.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_230.m_guide.sysGroup.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysGroup.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.m_guide.sysDecimal.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysDecimal.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((local_230.m_guide.sysDecimal.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysDecimal.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysDecimal.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QVLAStorage<1UL,_1UL,_256LL> *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr !=
      &local_150.super_QVLAStorage<1UL,_1UL,_256LL>) {
    QtPrivate::sizedFree
              (local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
               local_150.super_QVLABase<char>.super_QVLABaseBase.a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ParsingResult
QLocaleData::validateChars(QStringView str, NumberMode numMode, int decDigits,
                           QLocale::NumberOptions number_options) const
{
    ParsingResult result;
    result.buff.reserve(str.size());

    enum { Whole, Fractional, Exponent } state = Whole;
    const bool scientific = numMode == DoubleScientificMode;
    NumericTokenizer tokens(str, numericData(numMode), numMode);
    char last = '\0';

    while (!tokens.done()) {
        char c = tokens.nextToken();

        if (isAsciiDigit(c)) {
            switch (state) {
            case Whole:
                // Nothing special to do (unless we want to check grouping sizes).
                break;
            case Fractional:
                // If a double has too many digits in its fractional part it is Invalid.
                if (decDigits-- == 0)
                    return {};
                break;
            case Exponent:
                if (!isAsciiDigit(last)) {
                    // This is the first digit in the exponent (there may have beena '+'
                    // or '-' in before). If it's a zero, the exponent is zero-padded.
                    if (c == '0' && (number_options & QLocale::RejectLeadingZeroInExponent))
                        return {};
                }
                break;
            }

        } else {
            switch (c) {
            case '.':
                // If an integer has a decimal point, it is Invalid.
                // A double can only have one, at the end of its whole-number part.
                if (numMode == IntegerMode || state != Whole)
                    return {};
                // Even when decDigits is 0, we do allow the decimal point to be
                // present - just as long as no digits follow it.

                state = Fractional;
                break;

            case '+':
            case '-':
                // A sign can only appear at the start or after the e of scientific:
                if (last != '\0' && !(scientific && last == 'e'))
                    return {};
                break;

            case ',':
                // Grouping is only allowed after a digit in the whole-number portion:
                if ((number_options & QLocale::RejectGroupSeparator) || state != Whole
                        || !isAsciiDigit(last)) {
                    return {};
                }
                // We could check grouping sizes are correct, but fixup()s are
                // probably better off correcting any misplacement instead.
                break;

            case 'e':
                // Only one e is allowed and only in scientific:
                if (!scientific || state == Exponent)
                    return {};
                state = Exponent;
                break;

            default:
                // Nothing else can validly appear in a number.
                // NumericTokenizer allows letters of "inf" and "nan", but
                // validators don't accept those values.
                // For anything else, tokens.nextToken() must have returned 0.
                Q_ASSERT(!c || c == 'a' || c == 'f' || c == 'i' || c == 'n');
                return {};
            }
        }

        last = c;
        if (c != ',') // Skip grouping
            result.buff.append(c);
    }

    result.state = ParsingResult::Acceptable;

    // Intermediate if it ends with any character that requires a digit after
    // it to be valid e.g. group separator, sign, or exponent
    if (last == ',' || last == '-' || last == '+' || last == 'e')
        result.state = ParsingResult::Intermediate;

    return result;
}